

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm_client_data.c
# Opt level: O0

void deinitialize_hsm_system(void)

{
  hsm_client_x509_deinit();
  hsm_client_tpm_deinit();
  return;
}

Assistant:

void deinitialize_hsm_system(void)
{
#ifdef HSM_TYPE_HTTP_EDGE
    hsm_client_http_edge_deinit();
#endif
#if defined(HSM_TYPE_X509) || defined(HSM_TYPE_RIOT) || defined(HSM_AUTH_TYPE_CUSTOM)
    hsm_client_x509_deinit();
#endif
#if defined(HSM_TYPE_SAS_TOKEN)  || defined(HSM_AUTH_TYPE_CUSTOM)
    hsm_client_tpm_deinit();
#endif
}